

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool WriteObject(HSQUIRRELVM v,SQUserPointer up,SQWRITEFUNC write,SQObjectPtr *o)

{
  SQObjectType SVar1;
  SQUserPointer this;
  bool bVar2;
  SQChar *pSVar3;
  SQObjectType local_34;
  SQObjectPtr *pSStack_30;
  SQUnsignedInteger32 _type;
  SQObjectPtr *o_local;
  SQWRITEFUNC write_local;
  SQUserPointer up_local;
  HSQUIRRELVM v_local;
  
  local_34 = (o->super_SQObject)._type;
  pSStack_30 = o;
  o_local = (SQObjectPtr *)write;
  write_local = (SQWRITEFUNC)up;
  up_local = v;
  bVar2 = SafeWrite(v,write,up,&local_34,4);
  this = up_local;
  if (!bVar2) {
    return false;
  }
  SVar1 = (pSStack_30->super_SQObject)._type;
  if (SVar1 != OT_NULL) {
    if ((SVar1 == OT_BOOL) || (SVar1 == OT_INTEGER)) {
      bVar2 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)o_local,write_local,
                        &(pSStack_30->super_SQObject)._unVal,8);
      if (!bVar2) {
        return false;
      }
    }
    else if (SVar1 == OT_FLOAT) {
      bVar2 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)o_local,write_local,
                        &(pSStack_30->super_SQObject)._unVal,4);
      if (!bVar2) {
        return false;
      }
    }
    else {
      if (SVar1 != OT_STRING) {
        pSVar3 = GetTypeName(pSStack_30);
        SQVM::Raise_Error((SQVM *)this,"cannot serialize a %s",pSVar3);
        return false;
      }
      bVar2 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)o_local,write_local,
                        &(((pSStack_30->super_SQObject)._unVal.pTable)->super_SQDelegable).
                         super_SQCollectable._sharedstate,8);
      if (!bVar2) {
        return false;
      }
      bVar2 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)o_local,write_local,
                        &((pSStack_30->super_SQObject)._unVal.pTable)->_firstfree,
                        ((pSStack_30->super_SQObject)._unVal.pString)->_len);
      if (!bVar2) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool WriteObject(HSQUIRRELVM v,SQUserPointer up,SQWRITEFUNC write,SQObjectPtr &o)
{
    SQUnsignedInteger32 _type = (SQUnsignedInteger32)sq_type(o);
    _CHECK_IO(SafeWrite(v,write,up,&_type,sizeof(_type)));
    switch(sq_type(o)){
    case OT_STRING:
        _CHECK_IO(SafeWrite(v,write,up,&_string(o)->_len,sizeof(SQInteger)));
        _CHECK_IO(SafeWrite(v,write,up,_stringval(o),sq_rsl(_string(o)->_len)));
        break;
    case OT_BOOL:
    case OT_INTEGER:
        _CHECK_IO(SafeWrite(v,write,up,&_integer(o),sizeof(SQInteger)));break;
    case OT_FLOAT:
        _CHECK_IO(SafeWrite(v,write,up,&_float(o),sizeof(SQFloat)));break;
    case OT_NULL:
        break;
    default:
        v->Raise_Error(_SC("cannot serialize a %s"),GetTypeName(o));
        return false;
    }
    return true;
}